

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O3

int __thiscall
Refal2::
CDictionary<std::unique_ptr<Refal2::CPreparatoryFunction,_std::default_delete<Refal2::CPreparatoryFunction>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::AddKey(CDictionary<std::unique_ptr<Refal2::CPreparatoryFunction,_std::default_delete<Refal2::CPreparatoryFunction>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_color _Var2;
  int iVar3;
  pointer pcVar4;
  CKeyDataPair *pCVar5;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_bool>
  pVar6;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_50;
  
  paVar1 = &local_50.first.field_2;
  pcVar4 = (key->_M_dataplus)._M_p;
  local_50.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar4,pcVar4 + key->_M_string_length);
  local_50.second = this->size;
  pVar6 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,int>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                      *)&this->keyToIndex,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_50.first._M_dataplus._M_p);
  }
  _Var2 = pVar6.first._M_node._M_node[2]._M_color;
  if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    iVar3 = this->size;
    this->size = iVar3 + 1;
    if (this->capacity <= iVar3) {
      grow(this,this->capacity * 2);
    }
    pCVar5 = this->keyDataPairs;
    pCVar5[(int)_Var2].key._M_node = pVar6.first._M_node._M_node;
    pCVar5[(int)_Var2].data._M_t.
    super___uniq_ptr_impl<Refal2::CPreparatoryFunction,_std::default_delete<Refal2::CPreparatoryFunction>_>
    ._M_t.
    super__Tuple_impl<0UL,_Refal2::CPreparatoryFunction_*,_std::default_delete<Refal2::CPreparatoryFunction>_>
    .super__Head_base<0UL,_Refal2::CPreparatoryFunction_*,_false>._M_head_impl =
         (CPreparatoryFunction *)0x0;
  }
  return _Var2;
}

Assistant:

int CDictionary<Data, Key>::AddKey( const Key& key )
{
	typedef std::pair<typename CKeyToIndex::iterator, bool> CPair;
	CPair insert = keyToIndex.insert( std::make_pair( key, size ) );
	const int result = insert.first->second;
	if( insert.second ) {
		size++;
		if( capacity < size ) {
			grow( capacity * 2 );
		}
		new( keyDataPairs + result )CKeyDataPair( insert.first );
	}
	return result;
}